

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

bool boost::filesystem::detail::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  filesystem_error *this;
  error_code ec_00;
  allocator<char> local_99;
  error_code local_98;
  path parent;
  file_status parent_status;
  file_status p_status;
  path filename;
  string local_38;
  
  path::filename(&filename,p);
  if (filename.m_pathname._M_string_length == 2) {
    if ((*filename.m_pathname._M_dataplus._M_p == '.') &&
       (filename.m_pathname._M_dataplus._M_p[1] == '.')) goto LAB_0010c92c;
LAB_0010c94b:
    local_98.m_val = 0;
    local_98.m_cat = system::system_category();
    status((detail *)&p_status,p,&local_98);
    if (p_status.m_value == directory_file) {
      if (ec != (error_code *)0x0) {
        system::error_code::clear(ec);
      }
      bVar1 = false;
      goto LAB_0010ca09;
    }
    path::parent_path(&parent,p);
    bVar1 = operator!=(&parent,p);
    if (!bVar1) {
      __assert_fail("(parent != p)&&(\"internal error: p == p.parent_path()\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                    ,0x3bd,
                    "bool boost::filesystem::detail::create_directories(const path &, system::error_code *)"
                   );
    }
    if (((parent.m_pathname._M_string_length == 0) ||
        (status((detail *)&parent_status,&parent,&local_98), parent_status.m_value != file_not_found
        )) || (filesystem::create_directories(&parent,&local_98), local_98.m_val == 0)) {
      bVar1 = create_directory(p,ec);
    }
    else {
      if (ec == (error_code *)0x0) {
        this = (filesystem_error *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"boost::filesystem::create_directories",&local_99);
        ec_00._4_4_ = 0;
        ec_00.m_val = local_98.m_val;
        ec_00.m_cat = local_98.m_cat;
        filesystem_error::filesystem_error(this,&local_38,&parent,ec_00);
        __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      *(ulong *)ec = CONCAT44(local_98._4_4_,local_98.m_val);
      ec->m_cat = local_98.m_cat;
      bVar1 = false;
    }
  }
  else {
    if ((filename.m_pathname._M_string_length != 1) ||
       (*filename.m_pathname._M_dataplus._M_p != '.')) goto LAB_0010c94b;
LAB_0010c92c:
    path::parent_path(&parent,p);
    bVar1 = create_directories(&parent,ec);
  }
  std::__cxx11::string::~string((string *)&parent);
LAB_0010ca09:
  std::__cxx11::string::~string((string *)&filename);
  return bVar1;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool create_directories(const path& p, system::error_code* ec)
  {
    path filename(p.filename());
    if ((filename.native().size() == 1 && filename.native()[0] == dot)
      || (filename.native().size() == 2
        && filename.native()[0] == dot && filename.native()[1] == dot))
      return create_directories(p.parent_path(), ec);

    error_code local_ec;
    file_status p_status = status(p, local_ec);

    if (p_status.type() == directory_file)
    {
      if (ec != 0)
        ec->clear();
      return false;
    }

    path parent = p.parent_path();
    BOOST_ASSERT_MSG(parent != p, "internal error: p == p.parent_path()");
    if (!parent.empty())
    {
      // determine if the parent exists
      file_status parent_status = status(parent, local_ec);

      // if the parent does not exist, create the parent
      if (parent_status.type() == file_not_found)
      {
        create_directories(parent, local_ec);
        if (local_ec)
        {
          if (ec == 0)
            BOOST_FILESYSTEM_THROW(filesystem_error(
              "boost::filesystem::create_directories", parent, local_ec));
          else
            *ec = local_ec;
          return false;
        }
      }
    }

    // create the directory
    return create_directory(p, ec);
  }